

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_font_query_font_glyph
               (nk_handle handle,float height,nk_user_font_glyph *glyph,nk_rune codepoint,
               nk_rune next_codepoint)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  nk_font_glyph *pnVar5;
  float fVar6;
  
  if (glyph == (nk_user_font_glyph *)0x0) {
    __assert_fail("glyph",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x329d,
                  "void nk_font_query_font_glyph(nk_handle, float, struct nk_user_font_glyph *, nk_rune, nk_rune)"
                 );
  }
  if (handle.ptr != (void *)0x0) {
    if (*(long *)((long)handle.ptr + 0x58) != 0) {
      fVar6 = height / *(float *)((long)handle.ptr + 0x30);
      pnVar5 = nk_font_find_glyph((nk_font *)handle.ptr,codepoint);
      uVar1 = pnVar5->x0;
      uVar3 = pnVar5->y0;
      uVar2 = pnVar5->x1;
      uVar4 = pnVar5->y1;
      (glyph->offset).x = fVar6 * (float)uVar1;
      (glyph->offset).y = fVar6 * (float)uVar3;
      glyph->width = ((float)uVar2 - (float)uVar1) * fVar6;
      glyph->height = ((float)uVar4 - (float)uVar3) * fVar6;
      glyph->xadvance = fVar6 * pnVar5->xadvance;
      fVar6 = pnVar5->v0;
      glyph->uv[0].x = pnVar5->u0;
      glyph->uv[0].y = fVar6;
      fVar6 = pnVar5->v1;
      glyph->uv[1].x = pnVar5->u1;
      glyph->uv[1].y = fVar6;
      return;
    }
    __assert_fail("font->glyphs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x32a2,
                  "void nk_font_query_font_glyph(nk_handle, float, struct nk_user_font_glyph *, nk_rune, nk_rune)"
                 );
  }
  __assert_fail("font",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x32a1,
                "void nk_font_query_font_glyph(nk_handle, float, struct nk_user_font_glyph *, nk_rune, nk_rune)"
               );
}

Assistant:

NK_INTERN void
nk_font_query_font_glyph(nk_handle handle, float height,
    struct nk_user_font_glyph *glyph, nk_rune codepoint, nk_rune next_codepoint)
{
    float scale;
    const struct nk_font_glyph *g;
    struct nk_font *font;

    NK_ASSERT(glyph);
    NK_UNUSED(next_codepoint);

    font = (struct nk_font*)handle.ptr;
    NK_ASSERT(font);
    NK_ASSERT(font->glyphs);
    if (!font || !glyph)
        return;

    scale = height/font->info.height;
    g = nk_font_find_glyph(font, codepoint);
    glyph->width = (g->x1 - g->x0) * scale;
    glyph->height = (g->y1 - g->y0) * scale;
    glyph->offset = nk_vec2(g->x0 * scale, g->y0 * scale);
    glyph->xadvance = (g->xadvance * scale);
    glyph->uv[0] = nk_vec2(g->u0, g->v0);
    glyph->uv[1] = nk_vec2(g->u1, g->v1);
}